

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O0

void duckdb::MinMaxNOperation::
     Finalize<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::GreaterThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  LogicalType *pLVar1;
  MinMaxNState<duckdb::MinMaxFallbackValue,_duckdb::GreaterThan> *this;
  bool bVar2;
  MinMaxNState<duckdb::MinMaxFallbackValue,_duckdb::GreaterThan> **ppMVar3;
  idx_t iVar4;
  Vector *pVVar5;
  Vector *pVVar6;
  long lVar7;
  Vector *pVVar8;
  undefined1 *puVar9;
  ulong in_RCX;
  long in_R8;
  idx_t slot;
  HeapEntry<duckdb::string_t> *heap;
  list_entry_t *list_entry;
  MinMaxNState<duckdb::MinMaxFallbackValue,_duckdb::GreaterThan> *state_1;
  idx_t state_idx_1;
  idx_t rid;
  idx_t i_1;
  idx_t current_offset;
  Vector *child_data;
  list_entry_t *list_entries;
  MinMaxNState<duckdb::MinMaxFallbackValue,_duckdb::GreaterThan> *state;
  idx_t state_idx;
  idx_t i;
  idx_t new_entries;
  idx_t old_len;
  ValidityMask *mask;
  MinMaxNState<duckdb::MinMaxFallbackValue,_duckdb::GreaterThan> **states;
  UnifiedVectorFormat state_format;
  Vector *in_stack_fffffffffffffea8;
  Vector *in_stack_fffffffffffffeb0;
  ulong in_stack_fffffffffffffeb8;
  Vector *in_stack_fffffffffffffec0;
  Vector *idx;
  Vector *vector;
  ulong local_108;
  ulong local_d8;
  Vector *local_d0;
  ulong local_a8;
  UnifiedVectorFormat *in_stack_ffffffffffffff70;
  idx_t in_stack_ffffffffffffff78;
  Vector *in_stack_ffffffffffffff80;
  UnifiedVectorFormat local_70;
  long local_28;
  ulong local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffec0);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ppMVar3 = UnifiedVectorFormat::
            GetData<duckdb::MinMaxNState<duckdb::MinMaxFallbackValue,duckdb::GreaterThan>*>
                      (&local_70);
  FlatVector::Validity((Vector *)0xfc311b);
  local_d0 = (Vector *)ListVector::GetListSize(in_stack_fffffffffffffea8);
  for (local_a8 = 0; local_a8 < local_20; local_a8 = local_a8 + 1) {
    iVar4 = SelectionVector::get_index(local_70.sel,local_a8);
    UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan>::Size(&ppMVar3[iVar4]->heap);
  }
  ListVector::Reserve(in_stack_fffffffffffffeb0,(idx_t)in_stack_fffffffffffffea8);
  pVVar5 = (Vector *)FlatVector::GetData<duckdb::list_entry_t>((Vector *)0xfc3242);
  vector = pVVar5;
  pVVar6 = ListVector::GetEntry((Vector *)0xfc3263);
  idx = pVVar6;
  for (local_d8 = 0; local_d8 < local_20; local_d8 = local_d8 + 1) {
    lVar7 = local_d8 + local_28;
    iVar4 = SelectionVector::get_index(local_70.sel,local_d8);
    this = ppMVar3[iVar4];
    if (((this->is_initialized & 1U) == 0) ||
       (bVar2 = UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan>::IsEmpty(&this->heap),
       bVar2)) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffeb0,
                 (idx_t)in_stack_fffffffffffffea8);
    }
    else {
      *(Vector **)(&pVVar5->vector_type + lVar7 * 0x10) = local_d0;
      iVar4 = UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan>::Size(&this->heap);
      pLVar1 = (LogicalType *)(&pVVar5->vector_type + lVar7 * 0x10 + 8);
      pLVar1->id_ = (char)iVar4;
      pLVar1->physical_type_ = (char)(iVar4 >> 8);
      *(int6 *)&pLVar1->field_0x2 = (int6)(iVar4 >> 0x10);
      pVVar8 = (Vector *)
               UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan>::SortAndGetHeap
                         ((UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan> *)
                          in_stack_fffffffffffffeb0);
      local_108 = 0;
      in_stack_fffffffffffffec0 = pVVar8;
      while (in_stack_fffffffffffffeb8 = local_108,
            iVar4 = UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan>::Size(&this->heap),
            in_stack_fffffffffffffeb8 < iVar4) {
        puVar9 = &local_d0->field_0x1;
        in_stack_fffffffffffffea8 = pVVar6;
        UnaryAggregateHeap<duckdb::string_t,_duckdb::GreaterThan>::GetValue
                  ((HeapEntry<duckdb::string_t> *)((string_t *)&pVVar8->vector_type + local_108 * 2)
                  );
        MinMaxFallbackValue::Assign(vector,(idx_t)idx,(TYPE *)in_stack_fffffffffffffec0);
        local_108 = local_108 + 1;
        in_stack_fffffffffffffeb0 = local_d0;
        local_d0 = (Vector *)puVar9;
      }
    }
  }
  ListVector::SetListSize(in_stack_fffffffffffffeb0,(idx_t)in_stack_fffffffffffffea8);
  Vector::Verify(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffeb0);
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}